

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

int If_DsdManCheckNonDec_rec(If_DsdMan_t *p,int Id)

{
  int iVar1;
  If_DsdObj_t *pObj_00;
  bool bVar2;
  int local_30;
  int local_2c;
  int iFanin;
  int i;
  If_DsdObj_t *pObj;
  int Id_local;
  If_DsdMan_t *p_local;
  
  pObj_00 = If_DsdVecObj(&p->vObjs,Id);
  iVar1 = If_DsdObjType(pObj_00);
  if (iVar1 == 1) {
    p_local._4_4_ = 0;
  }
  else {
    iVar1 = If_DsdObjType(pObj_00);
    if (iVar1 == 2) {
      p_local._4_4_ = 0;
    }
    else {
      iVar1 = If_DsdObjType(pObj_00);
      if (iVar1 == 6) {
        p_local._4_4_ = 1;
      }
      else {
        local_2c = 0;
        while( true ) {
          iVar1 = If_DsdObjFaninNum(pObj_00);
          bVar2 = false;
          if (local_2c < iVar1) {
            local_30 = If_DsdObjFaninLit(pObj_00,local_2c);
            bVar2 = local_30 != 0;
          }
          if (!bVar2) {
            return 0;
          }
          iVar1 = Abc_Lit2Var(local_30);
          iVar1 = If_DsdManCheckNonDec_rec(p,iVar1);
          if (iVar1 != 0) break;
          local_2c = local_2c + 1;
        }
        p_local._4_4_ = 1;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int If_DsdManCheckNonDec_rec( If_DsdMan_t * p, int Id )
{
    If_DsdObj_t * pObj;
    int i, iFanin;
    pObj = If_DsdVecObj( &p->vObjs, Id );
    if ( If_DsdObjType(pObj) == IF_DSD_CONST0 )
        return 0;
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
        return 0;
    if ( If_DsdObjType(pObj) == IF_DSD_PRIME )
        return 1;
    If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        if ( If_DsdManCheckNonDec_rec( p, Abc_Lit2Var(iFanin) ) )
            return 1;
    return 0;
}